

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  uhugeint_t value;
  uhugeint_t value_00;
  hugeint_t frame_of_reference_00;
  uhugeint_t frame_of_reference_01;
  bool bVar1;
  byte width_00;
  byte bVar2;
  bitpacking_width_t bVar3;
  uhugeint_t *values;
  bool *validity;
  unsigned_long uVar4;
  idx_t iVar5;
  long in_RDI;
  uhugeint_t uVar6;
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *in_stack_00000010;
  bitpacking_width_t width;
  bitpacking_width_t regular_required_bitwidth;
  bitpacking_width_t delta_required_bitwidth;
  uhugeint_t frame_of_reference;
  bitpacking_width_t width_01;
  idx_t in_stack_fffffffffffffed0;
  uhugeint_t *in_stack_fffffffffffffee8;
  BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  bool local_9;
  
  if (*(long *)(in_RDI + 0x10818) == 0) {
    local_9 = true;
  }
  else if ((((*(byte *)(in_RDI + 0x108a1) & 1) == 0) &&
           (bVar1 = uhugeint_t::operator==
                              (in_stack_fffffffffffffef0->compression_buffer_internal,
                               in_stack_fffffffffffffee8), !bVar1)) ||
          ((*(char *)(in_RDI + 0x108a4) != '\x01' && (*(char *)(in_RDI + 0x108a4) != '\x02')))) {
    CalculateFORStats(in_stack_fffffffffffffef0);
    CalculateDeltaStats(in_stack_00000010);
    if ((*(byte *)(in_RDI + 0x108a2) & 1) != 0) {
      bVar1 = hugeint_t::operator==
                        ((hugeint_t *)in_stack_fffffffffffffef0,
                         (hugeint_t *)in_stack_fffffffffffffee8);
      if (((bVar1) && (*(char *)(in_RDI + 0x108a4) != '\x05')) &&
         (*(char *)(in_RDI + 0x108a4) != '\x04')) {
        EmptyBitpackingWriter::WriteConstantDelta<duckdb::uhugeint_t,duckdb::hugeint_t>
                  (*(hugeint_t *)(in_RDI + 0x10870),**(uhugeint_t **)(in_RDI + 0x8010),
                   *(idx_t *)(in_RDI + 0x10818),*(uhugeint_t **)(in_RDI + 0x8010),
                   (bool *)(in_RDI + 0x10018),*(void **)(in_RDI + 0x10828));
        *(long *)(in_RDI + 0x10820) = *(long *)(in_RDI + 0x10820) + 0x24;
        return true;
      }
      hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)0xaa2d49);
      uVar6.upper = (uint64_t)in_stack_fffffffffffffef0;
      uVar6.lower = (uint64_t)in_stack_fffffffffffffee8;
      width_00 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>(uVar6);
      value.upper = (uint64_t)in_stack_fffffffffffffef0;
      value.lower = (uint64_t)in_stack_fffffffffffffee8;
      bVar2 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>(value);
      if ((width_00 < bVar2) && (*(char *)(in_RDI + 0x108a4) != '\x05')) {
        frame_of_reference_00.upper._0_7_ = in_stack_ffffffffffffff00;
        frame_of_reference_00.lower = in_stack_fffffffffffffef8;
        frame_of_reference_00.upper._7_1_ = in_stack_ffffffffffffff07;
        SubtractFrameOfReference<duckdb::hugeint_t>
                  (in_stack_fffffffffffffef0,(hugeint_t *)in_stack_fffffffffffffee8,
                   frame_of_reference_00);
        values = (uhugeint_t *)(in_RDI + 0x8018);
        validity = (bool *)(in_RDI + 0x10018);
        uVar6 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)0xaa2e5a);
        iVar5 = *(idx_t *)(in_RDI + 0x10898);
        bVar3 = (bitpacking_width_t)(((hugeint_t *)(in_RDI + 0x10890))->lower >> 0x38);
        EmptyBitpackingWriter::WriteDeltaFor<duckdb::uhugeint_t,duckdb::hugeint_t>
                  (values,validity,width_00,uVar6,*(hugeint_t *)(in_RDI + 0x10890),
                   *(uhugeint_t **)(in_RDI + 0x8010),*(idx_t *)(in_RDI + 0x10818),
                   *(void **)(in_RDI + 0x10828));
        *(long *)(in_RDI + 0x10820) = *(long *)(in_RDI + 0x10820) + 0x10;
        uVar4 = AlignValue<unsigned_long,_8UL>(1);
        *(unsigned_long *)(in_RDI + 0x10820) = uVar4 + *(long *)(in_RDI + 0x10820);
        *(long *)(in_RDI + 0x10820) = *(long *)(in_RDI + 0x10820) + 0x10;
        iVar5 = BitpackingPrimitives::GetRequiredSize(iVar5,bVar3);
        *(idx_t *)(in_RDI + 0x10820) = iVar5 + *(long *)(in_RDI + 0x10820);
        return true;
      }
    }
    if ((*(byte *)(in_RDI + 0x108a3) & 1) == 0) {
      local_9 = false;
    }
    else {
      value_00.upper = (uint64_t)in_stack_fffffffffffffef0;
      value_00.lower = (uint64_t)in_stack_fffffffffffffee8;
      bVar3 = BitpackingPrimitives::MinimumBitWidth<duckdb::uhugeint_t,false>(value_00);
      frame_of_reference_01.upper._0_7_ = in_stack_ffffffffffffff00;
      frame_of_reference_01.lower = in_stack_fffffffffffffef8;
      frame_of_reference_01.upper._7_1_ = in_stack_ffffffffffffff07;
      SubtractFrameOfReference<duckdb::uhugeint_t>
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,frame_of_reference_01);
      width_01 = (bitpacking_width_t)((ulong)*(void **)(in_RDI + 0x10828) >> 0x38);
      EmptyBitpackingWriter::WriteFor<duckdb::uhugeint_t>
                (*(uhugeint_t **)(in_RDI + 0x8010),(bool *)(in_RDI + 0x10018),bVar3,
                 *(uhugeint_t *)(in_RDI + 0x10830),*(idx_t *)(in_RDI + 0x10818),
                 *(void **)(in_RDI + 0x10828));
      iVar5 = BitpackingPrimitives::GetRequiredSize(in_stack_fffffffffffffed0,width_01);
      *(idx_t *)(in_RDI + 0x10820) = iVar5 + *(long *)(in_RDI + 0x10820);
      *(long *)(in_RDI + 0x10820) = *(long *)(in_RDI + 0x10820) + 0x10;
      uVar4 = AlignValue<unsigned_long,_8UL>(1);
      *(unsigned_long *)(in_RDI + 0x10820) = uVar4 + *(long *)(in_RDI + 0x10820);
      local_9 = true;
    }
  }
  else {
    EmptyBitpackingWriter::WriteConstant<duckdb::uhugeint_t>
              (*(uhugeint_t *)(in_RDI + 0x10840),*(idx_t *)(in_RDI + 0x10818),
               *(void **)(in_RDI + 0x10828),(bool)(*(byte *)(in_RDI + 0x108a1) & 1));
    *(long *)(in_RDI + 0x10820) = *(long *)(in_RDI + 0x10820) + 0x14;
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}